

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnElemSegmentElemExpr_RefFunc
          (SharedValidator *this,Location *loc,Var *func_var)

{
  Result RVar1;
  Result RVar2;
  Index local_6c;
  Var local_68;
  
  Var::Var(&local_68,func_var);
  RVar1 = CheckFuncIndex(this,&local_68,(FuncType *)0x0);
  Var::~Var(&local_68);
  if (func_var->type_ == Index) {
    local_6c = (func_var->field_2).index_;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_insert_unique<unsigned_int>(&(this->declared_funcs_)._M_t,&local_6c);
    RVar2.enum_._1_3_ = 0;
    RVar2.enum_._0_1_ = RVar1.enum_ == Error;
    return (Result)RVar2.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/ir.h",
                0x38,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnElemSegmentElemExpr_RefFunc(const Location& loc,
                                                      Var func_var) {
  Result result = Result::Ok;
  result |= CheckFuncIndex(func_var);
  declared_funcs_.insert(func_var.index());
  return result;
}